

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

int __thiscall efsw::String::compare(String *this,size_t pos1,size_t n1,char *s)

{
  int iVar1;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_40
  ;
  
  String((String *)&local_40,s);
  iVar1 = std::__cxx11::
          basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
          ::compare(&this->mString,pos1,n1,&local_40);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&local_40);
  return iVar1;
}

Assistant:

int String::compare ( std::size_t pos1, std::size_t n1, const char* s) const
{
	return compare( pos1, n1, String( s ) );
}